

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O2

double duckdb_jaro_winkler::detail::jaro_similarity<char_const*,char_const*>
                 (char *P_first,char *P_last,char *T_first,char *T_last,double score_cutoff)

{
  long lVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  char cVar5;
  int64_t iVar6;
  int64_t CommonChars;
  uint64_t uVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int64_t Transpositions;
  long lVar14;
  char *pcVar15;
  ulong uVar16;
  const_iterator __begin3;
  ulong *puVar17;
  ulong *puVar18;
  uint64_t P_flag;
  ulong uVar19;
  long lVar20;
  uint64_t T_flag;
  ulong uVar21;
  bool bVar22;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar23;
  ulong local_10f8;
  long local_10e0;
  char *T_first_local;
  long local_10d0;
  long local_10c8;
  double local_10c0;
  double local_10b8;
  ulong local_10b0;
  ulong local_10a8;
  char *T_last_local;
  undefined1 local_1098 [16];
  FlaggedCharsMultiword flagged;
  char *P_last_local;
  char *P_first_local;
  ulong local_1048;
  char *local_1040;
  ulong local_1038;
  PatternMatchVector PM;
  
  local_10c8 = (long)T_last - (long)T_first;
  local_10d0 = (long)P_last - (long)P_first;
  dVar23 = 0.0;
  if (local_10d0 != 0 && local_10c8 != 0) {
    lVar10 = local_10d0;
    if (local_10c8 < local_10d0) {
      lVar10 = local_10c8;
    }
    local_10b8 = (double)local_10d0;
    local_10c0 = (double)local_10c8;
    if (score_cutoff <= ((double)lVar10 / local_10c0 + (double)lVar10 / local_10b8 + 1.0) / 3.0) {
      if (local_10c8 == 1 && local_10d0 == 1) {
        if (*P_first == *T_first) {
          dVar23 = 1.0;
        }
      }
      else {
        local_1098._8_4_ = in_XMM0_Dc;
        local_1098._0_8_ = score_cutoff;
        local_1098._12_4_ = in_XMM0_Dd;
        T_first_local = T_first;
        T_last_local = T_last;
        P_last_local = P_last;
        P_first_local = P_first;
        iVar6 = jaro_bounds<char_const*,char_const*>(P_first,&P_last_local,T_first,&T_last_local);
        CommonChars = common::remove_common_prefix<char_const*,char_const*>
                                (&P_first_local,P_last_local,&T_first_local,T_last_local);
        if (T_last_local == T_first_local || P_last_local == P_first_local) {
          lVar10 = 0;
        }
        else if ((long)T_last_local - (long)T_first_local < 0x41 &&
                 (long)P_last_local - (long)P_first_local < 0x41) {
          common::PatternMatchVector::PatternMatchVector<char_const*>
                    (&PM,P_first_local,P_last_local);
          pcVar15 = T_first_local;
          iVar13 = (int)iVar6;
          lVar10 = (long)T_last_local - (long)T_first_local;
          uVar8 = ~(-1L << ((char)iVar6 + 1U & 0x3f));
          if (0x3e < iVar13) {
            uVar8 = 0xffffffffffffffff;
          }
          lVar14 = (long)iVar13;
          if (lVar10 < iVar13) {
            lVar14 = lVar10;
          }
          lVar20 = 0;
          if (lVar14 < 1) {
            lVar14 = lVar20;
          }
          uVar21 = 0;
          uVar19 = 0;
          for (; lVar14 != lVar20; lVar20 = lVar20 + 1) {
            uVar7 = common::PatternMatchVector::get<char>(&PM,pcVar15[lVar20]);
            uVar11 = ~uVar19 & uVar8 & uVar7;
            uVar19 = uVar19 | -uVar11 & uVar11;
            uVar21 = uVar21 | (ulong)(uVar11 != 0) << ((byte)lVar20 & 0x3f);
            uVar8 = uVar8 * 2 + 1;
          }
          for (; lVar14 < lVar10; lVar14 = lVar14 + 1) {
            uVar7 = common::PatternMatchVector::get<char>(&PM,pcVar15[lVar14]);
            uVar11 = ~uVar19 & uVar8 & uVar7;
            uVar19 = uVar19 | -uVar11 & uVar11;
            uVar21 = uVar21 | (ulong)(uVar11 != 0) << ((byte)lVar14 & 0x3f);
            uVar8 = uVar8 * 2;
          }
          uVar8 = uVar19 - (uVar19 >> 1 & 0x5555555555555555);
          uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
          CommonChars = CommonChars +
                        (((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
          bVar4 = jaro_common_char_filter
                            (local_10d0,local_10c8,CommonChars,(double)local_1098._0_8_);
          pcVar15 = T_first_local;
          if (!bVar4) {
            return 0.0;
          }
          lVar10 = 0;
          for (; uVar21 != 0; uVar21 = uVar21 & uVar21 - 1) {
            lVar14 = 0;
            if (uVar21 != 0) {
              for (; (uVar21 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
              }
            }
            uVar7 = common::PatternMatchVector::get<char>(&PM,pcVar15[lVar14]);
            lVar10 = lVar10 + (ulong)((uVar7 & -uVar19 & uVar19) == 0);
            uVar19 = uVar19 ^ -uVar19 & uVar19;
          }
        }
        else {
          common::BlockPatternMatchVector::BlockPatternMatchVector<char_const*>
                    ((BlockPatternMatchVector *)&PM,P_first_local,P_last_local);
          uVar21 = (long)P_last_local - (long)P_first_local;
          local_1040 = T_first_local;
          uVar19 = (long)T_last_local - (long)T_first_local;
          flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&flagged.T_flag,
                     ((long)uVar19 / 0x40 + 1) - (ulong)((uVar19 & 0x3f) == 0));
          duckdb::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&flagged,
                     ((long)uVar21 / 0x40 + 1) - (ulong)((uVar21 & 0x3f) == 0));
          uVar8 = iVar6 + 1U;
          if ((long)uVar21 < (long)(iVar6 + 1U)) {
            uVar8 = uVar21;
          }
          lVar10 = (long)uVar8 / 0x40 + 1;
          uVar8 = ~(-1L << ((byte)uVar8 & 0x3f));
          uVar11 = 0;
          local_1038 = uVar19;
          if ((long)uVar19 < 1) {
            local_1038 = uVar11;
          }
          local_10f8 = 0xffffffffffffffff;
          local_1048 = uVar21;
          for (uVar19 = 0;
              puVar3 = flagged.T_flag.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
              puVar2 = flagged.P_flag.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start, uVar19 != local_1038; uVar19 = uVar19 + 1)
          {
            uVar21 = uVar19 >> 6;
            bVar9 = (byte)uVar19 & 0x3f;
            cVar5 = local_1040[uVar19];
            local_10a8 = uVar11;
            if (lVar10 == 1) {
              uVar7 = common::BlockPatternMatchVector::get<char>
                                ((BlockPatternMatchVector *)&PM,uVar11,cVar5);
              uVar12 = uVar8 & local_10f8 & uVar7;
              uVar16 = ~flagged.P_flag.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar11] & uVar12;
              flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar11] =
                   -uVar16 & uVar12 |
                   flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar11];
              flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar21] =
                   flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar21] | (ulong)(uVar16 != 0) << bVar9;
            }
            else {
              uVar12 = uVar11;
              local_10b0 = uVar8;
              if (local_10f8 != 0) {
                uVar7 = common::BlockPatternMatchVector::get<char>
                                  ((BlockPatternMatchVector *)&PM,uVar11,cVar5);
                uVar8 = ~flagged.P_flag.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11] & uVar7 & local_10f8;
                if (uVar8 != 0) {
                  flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar11] =
                       -uVar8 & uVar8 |
                       flagged.P_flag.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11];
                  flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar21] =
                       flagged.T_flag.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21] | 1L << bVar9;
                  uVar8 = local_10b0;
                  goto LAB_0137bb75;
                }
                uVar12 = uVar11 + 1;
              }
              for (; uVar8 = local_10b0, (long)uVar12 < (long)(uVar11 + lVar10 + -1);
                  uVar12 = uVar12 + 1) {
                uVar7 = common::BlockPatternMatchVector::get<char>
                                  ((BlockPatternMatchVector *)&PM,uVar12,cVar5);
                uVar8 = ~flagged.P_flag.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar12] & uVar7;
                if (uVar8 != 0) {
                  flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar12] =
                       uVar7 & -uVar8 |
                       flagged.P_flag.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
                  flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar21] =
                       flagged.T_flag.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar21] | 1L << bVar9;
                  uVar8 = local_10b0;
                  goto LAB_0137bb75;
                }
              }
              if (local_10b0 != 0) {
                uVar7 = common::BlockPatternMatchVector::get<char>
                                  ((BlockPatternMatchVector *)&PM,uVar12,cVar5);
                uVar11 = uVar7 & uVar8 &
                         ~flagged.P_flag.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar12];
                flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar12] =
                     -uVar11 & uVar11 |
                     flagged.P_flag.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar12];
                flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar21] =
                     flagged.T_flag.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21] | (ulong)(uVar11 != 0) << bVar9;
              }
            }
LAB_0137bb75:
            if ((long)(uVar19 + iVar6 + 1) < (long)local_1048) {
              lVar14 = uVar8 * 2;
              bVar4 = (long)(uVar19 + iVar6 + 2) < (long)local_1048;
              bVar22 = (uVar8 & 0x7fffffffffffffff) == 0x7fffffffffffffff;
              uVar8 = 0;
              if (!bVar22 || !bVar4) {
                uVar8 = lVar14 + 1;
              }
              lVar10 = lVar10 + (ulong)(bVar22 && bVar4);
            }
            uVar11 = local_10a8;
            if ((iVar6 <= (long)uVar19) && (local_10f8 = local_10f8 * 2, local_10f8 == 0)) {
              lVar10 = lVar10 + -1;
              uVar11 = local_10a8 + 1;
              local_10f8 = 0xffffffffffffffff;
            }
          }
          local_10e0 = 0;
          puVar18 = flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          puVar17 = flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)flagged.P_flag.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)flagged.P_flag.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start) <
              (ulong)((long)flagged.T_flag.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)flagged.T_flag.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start)) {
            for (; puVar17 !=
                   flagged.P_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish; puVar17 = puVar17 + 1) {
              uVar8 = *puVar17 - (*puVar17 >> 1 & 0x5555555555555555);
              uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
              local_10e0 = local_10e0 +
                           (((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
            }
          }
          else {
            for (; puVar18 !=
                   flagged.T_flag.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish; puVar18 = puVar18 + 1) {
              uVar8 = *puVar18 - (*puVar18 >> 1 & 0x5555555555555555);
              uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
              local_10e0 = local_10e0 +
                           (((uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
            }
          }
          CommonChars = CommonChars + local_10e0;
          cVar5 = jaro_common_char_filter
                            (local_10d0,local_10c8,CommonChars,
                             (double)CONCAT44(local_1098._4_4_,local_1098._0_4_));
          if ((bool)cVar5) {
            local_10a8 = CONCAT71(local_10a8._1_7_,cVar5);
            uVar8 = *puVar3;
            uVar19 = *puVar2;
            lVar14 = 0;
            lVar20 = 0;
            lVar10 = 0;
            pcVar15 = T_first_local;
            while (local_10e0 != 0) {
              while (uVar8 == 0) {
                pcVar15 = pcVar15 + 0x40;
                lVar1 = lVar14 + 1;
                lVar14 = lVar14 + 1;
                uVar8 = flagged.T_flag.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar1];
              }
              for (; uVar8 != 0; uVar8 = uVar8 & uVar8 - 1) {
                while (uVar19 == 0) {
                  lVar1 = lVar20 + 1;
                  lVar20 = lVar20 + 1;
                  uVar19 = flagged.P_flag.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar1];
                }
                lVar1 = 0;
                if (uVar8 != 0) {
                  for (; (uVar8 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
                  }
                }
                uVar7 = common::BlockPatternMatchVector::get<char>
                                  ((BlockPatternMatchVector *)&PM,lVar20,pcVar15[lVar1]);
                lVar10 = lVar10 + (ulong)((uVar7 & -uVar19 & uVar19) == 0);
                uVar19 = uVar19 ^ -uVar19 & uVar19;
                local_10e0 = local_10e0 + -1;
              }
              uVar8 = 0;
            }
            cVar5 = (char)local_10a8;
          }
          else {
            lVar10 = 0;
          }
          FlaggedCharsMultiword::~FlaggedCharsMultiword(&flagged);
          common::BlockPatternMatchVector::~BlockPatternMatchVector((BlockPatternMatchVector *)&PM);
          if (cVar5 == '\0') {
            return 0.0;
          }
        }
        dVar23 = (double)CommonChars;
        dVar23 = ((dVar23 - (double)(lVar10 / 2)) / dVar23 +
                 dVar23 / local_10c0 + dVar23 / local_10b8 + 0.0) / 3.0;
        dVar23 = (double)(-(ulong)((double)local_1098._0_8_ <= dVar23) & (ulong)dVar23);
      }
    }
  }
  return dVar23;
}

Assistant:

double jaro_similarity(InputIt1 P_first, InputIt1 P_last, InputIt2 T_first, InputIt2 T_last,
                       double score_cutoff)
{
    int64_t P_len = std::distance(P_first, P_last);
    int64_t T_len = std::distance(T_first, T_last);

    /* filter out based on the length difference between the two strings */
    if (!jaro_length_filter(P_len, T_len, score_cutoff)) {
        return 0.0;
    }

    if (P_len == 1 && T_len == 1) {
        return static_cast<double>(P_first[0] == T_first[0]);
    }

    int64_t Bound = jaro_bounds(P_first, P_last, T_first, T_last);

    /* common prefix never includes Transpositions */
    int64_t CommonChars = common::remove_common_prefix(P_first, P_last, T_first, T_last);
    int64_t Transpositions = 0;
    int64_t P_view_len = std::distance(P_first, P_last);
    int64_t T_view_len = std::distance(T_first, T_last);

    if (!P_view_len || !T_view_len) {
        /* already has correct number of common chars and transpositions */
    }
    else if (P_view_len <= 64 && T_view_len <= 64) {
        common::PatternMatchVector PM(P_first, P_last);
        auto flagged = flag_similar_characters_word(PM, P_first, P_last, T_first, T_last, static_cast<int>(Bound));
        CommonChars += count_common_chars(flagged);

        if (!jaro_common_char_filter(P_len, T_len, CommonChars, score_cutoff)) {
            return 0.0;
        }

        Transpositions = count_transpositions_word(PM, T_first, T_last, flagged);
    }
    else {
        common::BlockPatternMatchVector PM(P_first, P_last);
        auto flagged = flag_similar_characters_block(PM, P_first, P_last, T_first, T_last, Bound);
        int64_t FlaggedChars = count_common_chars(flagged);
        CommonChars += FlaggedChars;

        if (!jaro_common_char_filter(P_len, T_len, CommonChars, score_cutoff)) {
            return 0.0;
        }

        Transpositions = count_transpositions_block(PM, T_first, T_last, flagged, FlaggedChars);
    }

    double Sim = jaro_calculate_similarity(P_len, T_len, CommonChars, Transpositions);
    return common::result_cutoff(Sim, score_cutoff);
}